

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Matrix * MatrixRotateZYX(Matrix *__return_storage_ptr__,Vector3 angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_18;
  float fStack_14;
  
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m0 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  fVar1 = cosf(angle.z);
  fVar2 = sinf(angle.z);
  fStack_14 = angle.y;
  fVar3 = cosf(fStack_14);
  fVar4 = sinf(fStack_14);
  local_18 = angle.x;
  fVar5 = cosf(local_18);
  fVar6 = sinf(local_18);
  __return_storage_ptr__->m0 = fVar1 * fVar3;
  __return_storage_ptr__->m4 = fVar1 * fVar4 * fVar6 - fVar2 * fVar5;
  __return_storage_ptr__->m8 = fVar2 * fVar6 + fVar4 * fVar1 * fVar5;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m1 = fVar2 * fVar3;
  __return_storage_ptr__->m5 = fVar2 * fVar4 * fVar6 + fVar1 * fVar5;
  __return_storage_ptr__->m9 = fVar2 * fVar5 * fVar4 - fVar1 * fVar6;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m2 = -fVar4;
  __return_storage_ptr__->m6 = fVar6 * fVar3;
  __return_storage_ptr__->m10 = fVar3 * fVar5;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMAPI Matrix MatrixRotateZYX(Vector3 angle)
{
    Matrix result = { 0 };

    float cz = cosf(angle.z);
    float sz = sinf(angle.z);
    float cy = cosf(angle.y);
    float sy = sinf(angle.y);
    float cx = cosf(angle.x);
    float sx = sinf(angle.x);

    result.m0 = cz*cy;
    result.m4 = cz*sy*sx - cx*sz;
    result.m8 = sz*sx + cz*cx*sy;
    result.m12 = 0;

    result.m1 = cy*sz;
    result.m5 = cz*cx + sz*sy*sx;
    result.m9 = cx*sz*sy - cz*sx;
    result.m13 = 0;

    result.m2 = -sy;
    result.m6 = cy*sx;
    result.m10 = cy*cx;
    result.m14 = 0;

    result.m3 = 0;
    result.m7 = 0;
    result.m11 = 0;
    result.m15 = 1;

    return result;
}